

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexTryHdr(Wal *pWal,int *pChanged)

{
  int iVar1;
  WalIndexHdr *__src;
  undefined4 *in_RSI;
  Wal *in_RDI;
  WalIndexHdr *aHdr;
  WalIndexHdr h2;
  WalIndexHdr h1;
  u32 aCksum [2];
  undefined1 local_80 [48];
  u8 local_50 [12];
  char local_44;
  u32 local_28;
  int local_24;
  u32 local_20;
  int local_1c;
  undefined4 *local_18;
  Wal *local_10;
  int local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  __src = walIndexHdr(in_RDI);
  memcpy(local_50,__src,0x30);
  walShmBarrier((Wal *)0x1492ec);
  memcpy(local_80,__src + 1,0x30);
  iVar1 = memcmp(local_50,local_80,0x30);
  if (iVar1 == 0) {
    if (local_44 == '\0') {
      local_4 = 1;
    }
    else {
      walChecksumBytes(1,local_50,0x28,(u32 *)0x0,&local_20);
      if ((local_20 == local_28) && (local_1c == local_24)) {
        iVar1 = memcmp(&local_10->hdr,local_50,0x30);
        if (iVar1 != 0) {
          *local_18 = 1;
          memcpy(&local_10->hdr,local_50,0x30);
          local_10->szPage =
               ((local_10->hdr).szPage & 0xfe00) + ((local_10->hdr).szPage & 1) * 0x10000;
        }
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int walIndexTryHdr(Wal *pWal, int *pChanged){
  u32 aCksum[2];                  /* Checksum on the header content */
  WalIndexHdr h1, h2;             /* Two copies of the header content */
  WalIndexHdr volatile *aHdr;     /* Header in shared memory */

  /* The first page of the wal-index must be mapped at this point. */
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Read the header. This might happen concurrently with a write to the
  ** same area of shared memory on a different CPU in a SMP,
  ** meaning it is possible that an inconsistent snapshot is read
  ** from the file. If this happens, return non-zero.
  **
  ** There are two copies of the header at the beginning of the wal-index.
  ** When reading, read [0] first then [1].  Writes are in the reverse order.
  ** Memory barriers are used to prevent the compiler or the hardware from
  ** reordering the reads and writes.
  */
  aHdr = walIndexHdr(pWal);
  memcpy(&h1, (void *)&aHdr[0], sizeof(h1));
  walShmBarrier(pWal);
  memcpy(&h2, (void *)&aHdr[1], sizeof(h2));

  if( memcmp(&h1, &h2, sizeof(h1))!=0 ){
    return 1;   /* Dirty read */
  }  
  if( h1.isInit==0 ){
    return 1;   /* Malformed header - probably all zeros */
  }
  walChecksumBytes(1, (u8*)&h1, sizeof(h1)-sizeof(h1.aCksum), 0, aCksum);
  if( aCksum[0]!=h1.aCksum[0] || aCksum[1]!=h1.aCksum[1] ){
    return 1;   /* Checksum does not match */
  }

  if( memcmp(&pWal->hdr, &h1, sizeof(WalIndexHdr)) ){
    *pChanged = 1;
    memcpy(&pWal->hdr, &h1, sizeof(WalIndexHdr));
    pWal->szPage = (pWal->hdr.szPage&0xfe00) + ((pWal->hdr.szPage&0x0001)<<16);
    testcase( pWal->szPage<=32768 );
    testcase( pWal->szPage>=65536 );
  }

  /* The header was successfully read. Return zero. */
  return 0;
}